

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_tests.cpp
# Opt level: O1

void __thiscall validation_tests::test_assumeutxo::test_method(test_assumeutxo *this)

{
  undefined8 uVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  undefined1 uVar5;
  int *piVar6;
  undefined8 *puVar7;
  AssumeutxoData *pAVar8;
  iterator in_R8;
  iterator pvVar9;
  iterator in_R9;
  iterator pvVar10;
  long in_FS_OFFSET;
  byte bVar11;
  initializer_list<int> __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  check_type cVar12;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  vector<int,_std::allocator<int>_> bad_heights;
  unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> params;
  char *local_1d0;
  char *local_1c8 [2];
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  undefined1 local_178 [96];
  AssumeutxoData out110_2;
  undefined1 local_c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_b8;
  AssumeutxoData out110;
  undefined1 local_58 [8];
  _List_node_base *p_Stack_50;
  _List_node_base *local_48;
  _Base_ptr p_Stack_40;
  undefined8 local_38;
  
  bVar11 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CreateChainParams((ArgsManager *)&params,
                    (ChainType)
                    (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
                    super_BasicTestingSetup.m_node.args);
  local_178._0_8_ = (_func_int **)0x6400000000;
  local_178._8_8_ = (_Base_ptr)0x730000006f;
  local_178._16_8_ = (_Base_ptr)0xd3000000d1;
  __l._M_len = 6;
  __l._M_array = (iterator)local_178;
  std::vector<int,_std::allocator<int>_>::vector(&bad_heights,__l,(allocator_type *)&out110);
  for (piVar6 = bad_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar6 != bad_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish; piVar6 = piVar6 + 1) {
    piVar3 = *(int **)((long)params._M_t.
                             super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                             .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl +
                      0x308);
    uVar5 = 1;
    if (piVar3 != *(int **)((long)params._M_t.
                                  super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                                  .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl +
                           0x310)) {
      iVar2 = *piVar3;
      while (iVar2 != *piVar6) {
        piVar3 = piVar3 + 0x14;
        if (piVar3 == *(int **)((long)params._M_t.
                                      super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                                      .super__Head_base<0UL,_const_CChainParams_*,_false>.
                                      _M_head_impl + 0x310)) goto LAB_0078d044;
        iVar2 = *piVar3;
      }
      uVar5 = 0;
    }
LAB_0078d044:
    local_200 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_1f8 = "";
    local_210 = &boost::unit_test::basic_cstring<char_const>::null;
    local_208 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar12 = 0x78d085;
    file.m_end = (iterator)0x8d;
    file.m_begin = (iterator)&local_200;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_210,msg);
    out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[4] =
         '\0';
    out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[5] =
         '\0';
    out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[6] =
         '\0';
    out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[7] =
         '\0';
    out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[8] =
         '\0';
    out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[9] =
         '\0';
    out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[10]
         = '\0';
    out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xb]
         = '\0';
    out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xc]
         = '\0';
    out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xd]
         = '\0';
    out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xe]
         = '\0';
    out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xf]
         = '\0';
    out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [0x10] = '\0';
    out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [0x11] = '\0';
    out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [0x12] = '\0';
    out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [0x13] = '\0';
    out110_2._0_8_ = anon_var_dwarf_1eee5ca;
    out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems.
    _4_8_ = (long)"!out" + 4;
    local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
    local_178._0_8_ = &PTR__lazy_ostream_013abc70;
    local_178._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_178._24_8_ = &out110_2;
    local_220 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_218 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x0;
    out110.height._0_1_ = uVar5;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&out110,(lazy_ostream *)local_178,1,0,WARN,_cVar12,
               (size_t)&local_220,0x8d);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.
                      m_data._M_elems + 0xc));
  }
  piVar6 = *(int **)((long)params._M_t.
                           super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                           .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl + 0x308)
  ;
  if (piVar6 != *(int **)((long)params._M_t.
                                super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                                .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl +
                         0x310)) {
    iVar2 = *piVar6;
    while (iVar2 != 0x6e) {
      piVar6 = piVar6 + 0x14;
      if (piVar6 == *(int **)((long)params._M_t.
                                    super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                                    .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl
                             + 0x310)) goto LAB_0078d19c;
      iVar2 = *piVar6;
    }
    puVar7 = (undefined8 *)local_178;
    for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
      *puVar7 = *(undefined8 *)piVar6;
      piVar6 = piVar6 + (ulong)bVar11 * -4 + 2;
      puVar7 = puVar7 + (ulong)bVar11 * -2 + 1;
    }
  }
LAB_0078d19c:
  puVar7 = (undefined8 *)local_178;
  pAVar8 = &out110;
  for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
    uVar1 = *puVar7;
    pAVar8->height = (int)uVar1;
    (pAVar8->hash_serialized).super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [0] = (char)((ulong)uVar1 >> 0x20);
    (pAVar8->hash_serialized).super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [1] = (char)((ulong)uVar1 >> 0x28);
    (pAVar8->hash_serialized).super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [2] = (char)((ulong)uVar1 >> 0x30);
    (pAVar8->hash_serialized).super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [3] = (char)((ulong)uVar1 >> 0x38);
    puVar7 = puVar7 + (ulong)bVar11 * -2 + 1;
    pAVar8 = (AssumeutxoData *)((long)pAVar8 + (ulong)bVar11 * -0x10 + 8);
  }
  local_230 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_228 = "";
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x91;
  file_00.m_begin = (iterator)&local_230;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_240,
             msg_00);
  p_Stack_50 = (_List_node_base *)((ulong)p_Stack_50 & 0xffffffffffffff00);
  local_58 = (undefined1  [8])&PTR__lazy_ostream_013abb30;
  local_48 = (_List_node_base *)boost::unit_test::lazy_ostream::inst;
  p_Stack_40 = (_Base_ptr)0xf6cf21;
  base_blob<256u>::ToString_abi_cxx11_((string *)local_c8,&out110.hash_serialized);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_c8,
                     "6657b736d4fe4db0cbc796789e812d5dba7f5c143764b1b6905612f1830609d1");
  local_198[0] = iVar2 == 0;
  local_198._8_8_ = (element_type *)0x0;
  local_198._16_8_ = (sp_counted_base *)0x0;
  local_1b8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_1b8._8_8_ = "";
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_178._16_8_ = boost::unit_test::lazy_ostream::inst;
  out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems.
  _20_8_ = local_1b8 + 0x18;
  local_1b8._24_8_ = "6657b736d4fe4db0cbc796789e812d5dba7f5c143764b1b6905612f1830609d1";
  out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems.
  _4_8_ = out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data.
          _M_elems._4_8_ & 0xffffffffffffff00;
  out110_2._0_8_ = &PTR__lazy_ostream_013ac4f0;
  out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems.
  _12_8_ = boost::unit_test::lazy_ostream::inst;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  local_1c8[0] = (char *)local_c8;
  local_178._24_8_ = (_Base_ptr)local_1c8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_198,(lazy_ostream *)local_58,1,2,REQUIRE,0xf79664,
             (size_t)local_1b8,0x91,local_178,
             "\"6657b736d4fe4db0cbc796789e812d5dba7f5c143764b1b6905612f1830609d1\"",&out110_2);
  boost::detail::shared_count::~shared_count((shared_count *)(local_198 + 0x10));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._0_8_ != &aStack_b8) {
    operator_delete((void *)local_c8._0_8_,aStack_b8._M_allocated_capacity + 1);
  }
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x92;
  file_01.m_begin = (iterator)&local_250;
  msg_01.m_end = pvVar10;
  msg_01.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_260,
             msg_01);
  p_Stack_50 = (_List_node_base *)((ulong)p_Stack_50 & 0xffffffffffffff00);
  local_58 = (undefined1  [8])&PTR__lazy_ostream_013abb30;
  local_48 = (_List_node_base *)boost::unit_test::lazy_ostream::inst;
  p_Stack_40 = (_Base_ptr)0xf6cf21;
  local_1b8._0_8_ = &out110.m_chain_tx_count;
  local_1b8._24_4_ = 0x6f;
  local_c8[0] = out110.m_chain_tx_count == 0x6f;
  local_c8._8_8_ = 0;
  aStack_b8._M_allocated_capacity = 0;
  local_198._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_198._8_8_ = "";
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_013abb70;
  local_178._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1c8[0] = local_1b8 + 0x18;
  out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems.
  _4_8_ = out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data.
          _M_elems._4_8_ & 0xffffffffffffff00;
  out110_2._0_8_ = &PTR__lazy_ostream_013abbb0;
  out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems.
  _12_8_ = boost::unit_test::lazy_ostream::inst;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  local_178._24_8_ = (_Base_ptr)local_1b8;
  out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems.
  _20_8_ = (_Base_ptr)local_1c8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_c8,(lazy_ostream *)local_58,1,2,REQUIRE,0xf7970a,
             (size_t)local_198,0x92,local_178,"111U",&out110_2);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_b8._M_allocated_capacity);
  local_58 = (undefined1  [8])0x98c0aec0ab50425c;
  p_Stack_50 = (_List_node_base *)0x4105647a3c4fd9f2;
  local_48 = (_List_node_base *)0x7ee134edceeeeaaa;
  p_Stack_40 = (_Base_ptr)0x696e92821f65549c;
  CChainParams::AssumeutxoForBlockhash
            ((optional<AssumeutxoData> *)local_178,
             (CChainParams *)
             params._M_t.
             super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>.
             _M_t.
             super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>.
             super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl,(uint256 *)local_58);
  puVar7 = (undefined8 *)local_178;
  pAVar8 = &out110_2;
  for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
    uVar1 = *puVar7;
    pAVar8->height = (int)uVar1;
    (pAVar8->hash_serialized).super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [0] = (char)((ulong)uVar1 >> 0x20);
    (pAVar8->hash_serialized).super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [1] = (char)((ulong)uVar1 >> 0x28);
    (pAVar8->hash_serialized).super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [2] = (char)((ulong)uVar1 >> 0x30);
    (pAVar8->hash_serialized).super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [3] = (char)((ulong)uVar1 >> 0x38);
    puVar7 = puVar7 + (ulong)bVar11 * -2 + 1;
    pAVar8 = (AssumeutxoData *)((long)pAVar8 + (ulong)bVar11 * -0x10 + 8);
  }
  local_270 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_268 = "";
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x95;
  file_02.m_begin = (iterator)&local_270;
  msg_02.m_end = pvVar10;
  msg_02.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_280,
             msg_02);
  local_c8._8_8_ = local_c8._8_8_ & 0xffffffffffffff00;
  local_c8._0_8_ = &PTR__lazy_ostream_013abb30;
  aStack_b8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_b8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  base_blob<256u>::ToString_abi_cxx11_((string *)local_198,&out110_2.hash_serialized);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                     "6657b736d4fe4db0cbc796789e812d5dba7f5c143764b1b6905612f1830609d1");
  local_1b8[0] = iVar2 == 0;
  local_1b8._8_8_ = (element_type *)0x0;
  local_1b8._16_8_ = (_Base_ptr)0x0;
  local_1c8[0] = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_1c8[1] = "";
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_178._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_178._24_8_ = local_1b8 + 0x18;
  local_1d0 = "6657b736d4fe4db0cbc796789e812d5dba7f5c143764b1b6905612f1830609d1";
  p_Stack_50 = (_List_node_base *)((ulong)p_Stack_50 & 0xffffffffffffff00);
  local_58 = (undefined1  [8])&PTR__lazy_ostream_013ac4f0;
  local_48 = (_List_node_base *)boost::unit_test::lazy_ostream::inst;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  local_1b8._24_8_ = (_Base_ptr)local_198;
  p_Stack_40 = (_Base_ptr)&local_1d0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1b8,(lazy_ostream *)local_c8,1,2,REQUIRE,0xf79727,
             (size_t)local_1c8,0x95,local_178,
             "\"6657b736d4fe4db0cbc796789e812d5dba7f5c143764b1b6905612f1830609d1\"",
             (uint256 *)local_58);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1b8 + 0x10));
  if ((_Base_ptr)local_198._0_8_ != (_Base_ptr)(local_198 + 0x10)) {
    operator_delete((void *)local_198._0_8_,(ulong)((long)(_func_int ***)local_198._16_8_ + 1));
  }
  local_290 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x96;
  file_03.m_begin = (iterator)&local_290;
  msg_03.m_end = pvVar10;
  msg_03.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2a0,
             msg_03);
  local_c8._8_8_ = local_c8._8_8_ & 0xffffffffffffff00;
  local_c8._0_8_ = &PTR__lazy_ostream_013abb30;
  aStack_b8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_b8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1c8[0] = (char *)&out110_2.m_chain_tx_count;
  local_198[0] = out110_2.m_chain_tx_count == 0x6f;
  local_1d0 = (char *)CONCAT44(local_1d0._4_4_,0x6f);
  local_198._8_8_ = (element_type *)0x0;
  local_198._16_8_ = (sp_counted_base *)0x0;
  local_1b8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_1b8._8_8_ = "";
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_013abb70;
  local_178._16_8_ = boost::unit_test::lazy_ostream::inst;
  p_Stack_50 = (_List_node_base *)((ulong)p_Stack_50 & 0xffffffffffffff00);
  local_58 = (undefined1  [8])&PTR__lazy_ostream_013abbb0;
  local_48 = (_List_node_base *)boost::unit_test::lazy_ostream::inst;
  p_Stack_40 = (_Base_ptr)(local_1b8 + 0x18);
  local_1b8._24_8_ = (_Base_ptr)&local_1d0;
  local_178._24_8_ = (_Base_ptr)local_1c8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_198,(lazy_ostream *)local_c8,1,2,REQUIRE,0xf7974b,
             (size_t)local_1b8,0x96,local_178,"111U",(uint256 *)local_58);
  boost::detail::shared_count::~shared_count((shared_count *)(local_198 + 0x10));
  if (bad_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(bad_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)bad_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)bad_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            (&params);
  if (*(pointer *)(in_FS_OFFSET + 0x28) == (pointer)local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_assumeutxo)
{
    const auto params = CreateChainParams(*m_node.args, ChainType::REGTEST);

    // These heights don't have assumeutxo configurations associated, per the contents
    // of kernel/chainparams.cpp.
    std::vector<int> bad_heights{0, 100, 111, 115, 209, 211};

    for (auto empty : bad_heights) {
        const auto out = params->AssumeutxoForHeight(empty);
        BOOST_CHECK(!out);
    }

    const auto out110 = *params->AssumeutxoForHeight(110);
    BOOST_CHECK_EQUAL(out110.hash_serialized.ToString(), "6657b736d4fe4db0cbc796789e812d5dba7f5c143764b1b6905612f1830609d1");
    BOOST_CHECK_EQUAL(out110.m_chain_tx_count, 111U);

    const auto out110_2 = *params->AssumeutxoForBlockhash(uint256{"696e92821f65549c7ee134edceeeeaaa4105647a3c4fd9f298c0aec0ab50425c"});
    BOOST_CHECK_EQUAL(out110_2.hash_serialized.ToString(), "6657b736d4fe4db0cbc796789e812d5dba7f5c143764b1b6905612f1830609d1");
    BOOST_CHECK_EQUAL(out110_2.m_chain_tx_count, 111U);
}